

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::showMonth(QCalendarWidgetPrivate *this,int year,int month)

{
  QCalendarModel *this_00;
  QObject *pQVar1;
  long in_FS_OFFSET;
  int local_50;
  int local_4c;
  void *local_48;
  int *piStack_40;
  int *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->m_model;
  if ((this_00->m_shownYear != year) || (this_00->m_shownMonth != month)) {
    pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
    if ((this_00->m_shownYear != year) || (this_00->m_shownMonth != month)) {
      this_00->m_shownYear = year;
      this_00->m_shownMonth = month;
      QtPrivate::QCalendarModel::internalUpdate(this_00);
    }
    updateNavigationBar(this);
    piStack_40 = &local_4c;
    local_38 = &local_50;
    local_48 = (void *)0x0;
    local_50 = month;
    local_4c = year;
    QMetaObject::activate(pQVar1,&QCalendarWidget::staticMetaObject,3,&local_48);
    (**(code **)(*(long *)&(this->m_view->super_QTableView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x268))();
    (this->cachedSizeHint).wd = -1;
    (this->cachedSizeHint).ht = -1;
    update(this);
    updateMonthMenu(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::showMonth(int year, int month)
{
    if (m_model->m_shownYear == year && m_model->m_shownMonth == month)
        return;
    Q_Q(QCalendarWidget);
    m_model->showMonth(year, month);
    updateNavigationBar();
    emit q->currentPageChanged(year, month);
    m_view->internalUpdate();
    cachedSizeHint = QSize();
    update();
    updateMonthMenu();
}